

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void do_follow(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  char *pcVar4;
  char arg [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    pcVar4 = "Follow whom?\n\r";
  }
  else {
    ch_00 = get_char_room(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar4 = "They aren\'t here.\n\r";
    }
    else {
      bVar2 = is_affected_by(ch,0x12);
      if ((bVar2) && (ch->master != (CHAR_DATA *)0x0)) {
        pcVar4 = "But you\'d rather follow $N!";
        ch_00 = ch->master;
LAB_0023e003:
        act(pcVar4,ch,(void *)0x0,ch_00,3);
        return;
      }
      if (ch_00 == ch) {
        if (ch->master != (CHAR_DATA *)0x0) {
          stop_follower(ch);
          return;
        }
        pcVar4 = "You already follow yourself.\n\r";
      }
      else {
        bVar2 = is_npc(ch_00);
        if (((!bVar2) && ((ch_00->act[0] & 0x20000) != 0)) &&
           ((iVar3 = get_skill(ch,(int)gsn_trail), iVar3 == 0 || (bVar2 = can_see(ch_00,ch), bVar2))
           )) {
          iVar3 = get_skill(ch,(int)gsn_trail);
          if ((0 < iVar3) && (bVar2 = can_see(ch_00,ch), bVar2)) {
            act("You can\'t very well trail someone if they can see you.",ch,(void *)0x0,(void *)0x0
                ,3);
          }
          pcVar4 = "$N doesn\'t seem to want any followers.\n\r";
          goto LAB_0023e003;
        }
        bVar2 = is_affected(ch_00,(int)gsn_sphere_of_plasma);
        if (bVar2) {
          pcVar4 = "They are encased in a sphere of plasma!\n\r";
        }
        else {
          bVar2 = is_affected(ch,(int)gsn_sphere_of_plasma);
          if (!bVar2) {
            pbVar1 = (byte *)((long)ch->act + 2);
            *pbVar1 = *pbVar1 & 0xfd;
            if (ch->master != (CHAR_DATA *)0x0) {
              stop_follower(ch);
            }
            add_follower(ch,ch_00);
            return;
          }
          pcVar4 = "You are encased in a sphere of plasma!\n\r";
        }
      }
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_follow(CHAR_DATA *ch, char *argument)
{
	/* RT changed to allow unlimited following and follow the NOFOLLOW rules */
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Follow whom?\n\r", ch);
		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_CHARM) && ch->master != nullptr)
	{
		act("But you'd rather follow $N!", ch, nullptr, ch->master, TO_CHAR);
		return;
	}

	if (victim == ch)
	{
		if (ch->master == nullptr)
		{
			send_to_char("You already follow yourself.\n\r", ch);
			return;
		}

		stop_follower(ch);
		return;
	}

	if (!is_npc(victim) && IS_SET(victim->act, PLR_NOFOLLOW) && (get_skill(ch, gsn_trail) == 0 || can_see(victim, ch)))
	{
		if (get_skill(ch, gsn_trail) > 0 && can_see(victim, ch))
			act("You can't very well trail someone if they can see you.", ch, nullptr, nullptr, TO_CHAR);

		act("$N doesn't seem to want any followers.\n\r", ch, nullptr, victim, TO_CHAR);
		return;
	}

	if (is_affected(victim, gsn_sphere_of_plasma))
	{
		send_to_char("They are encased in a sphere of plasma!\n\r", ch);
		return;
	}
	if (is_affected(ch, gsn_sphere_of_plasma))
	{
		send_to_char("You are encased in a sphere of plasma!\n\r", ch);
		return;
	}

	REMOVE_BIT(ch->act, PLR_NOFOLLOW);

	if (ch->master != nullptr)
		stop_follower(ch);

	add_follower(ch, victim);
}